

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O1

int __thiscall
QFontDatabasePrivate::addAppFont(QFontDatabasePrivate *this,QByteArray *fontData,QString *fileName)

{
  ulong i;
  ApplicationFont *pAVar1;
  long lVar2;
  Data *pDVar3;
  qsizetype qVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  int iVar7;
  qsizetype *pqVar8;
  undefined4 extraout_var;
  pointer pAVar9;
  QFontCache *this_00;
  int iVar10;
  ulong uVar11;
  long in_FS_OFFSET;
  bool bVar12;
  QArrayDataPointer<QString> local_130;
  QArrayData *local_118;
  QArrayData *pQStack_110;
  char *local_108;
  QString local_f8;
  ApplicationFont local_d8;
  QString local_88;
  QByteArray QStack_70;
  QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.d.d = (Data *)0x0;
  local_88.d.ptr = (char16_t *)0x0;
  local_88.d.size = 0;
  QStack_70.d.d = (Data *)0x0;
  QStack_70.d.ptr = (char *)0x0;
  QStack_70.d.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (Properties *)0x0;
  local_58.size = 0;
  QByteArray::operator=(&QStack_70,fontData);
  QString::operator=(&local_88,fileName);
  i = (this->applicationFonts).d.size;
  bVar12 = i != 0;
  if (bVar12) {
    pAVar1 = (this->applicationFonts).d.ptr;
    if ((pAVar1->fileName).d.size == 0) {
      uVar11 = 0;
    }
    else {
      pqVar8 = &pAVar1[1].fileName.d.size;
      uVar11 = 0;
      do {
        if (i - 1 == uVar11) goto LAB_0049e0b9;
        uVar11 = uVar11 + 1;
        lVar2 = *pqVar8;
        pqVar8 = pqVar8 + 9;
      } while (lVar2 != 0);
      bVar12 = uVar11 < i;
    }
    iVar10 = (int)uVar11;
    if (bVar12) goto LAB_0049e14b;
  }
LAB_0049e0b9:
  local_d8.properties.d.d = (Data *)0x0;
  local_d8.properties.d.ptr = (Properties *)0x0;
  local_d8.data.d.ptr = (char *)0x0;
  local_d8.data.d.size = 0;
  local_d8.fileName.d.size = 0;
  local_d8.data.d.d = (Data *)0x0;
  local_d8.fileName.d.d = (Data *)0x0;
  local_d8.fileName.d.ptr = (char16_t *)0x0;
  local_d8.properties.d.size = 0;
  QtPrivate::QMovableArrayOps<QFontDatabasePrivate::ApplicationFont>::
  emplace<QFontDatabasePrivate::ApplicationFont>
            ((QMovableArrayOps<QFontDatabasePrivate::ApplicationFont> *)&this->applicationFonts,i,
             &local_d8);
  QList<QFontDatabasePrivate::ApplicationFont>::end(&this->applicationFonts);
  QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties>::~QArrayDataPointer
            (&local_d8.properties.d);
  if (&(local_d8.data.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.data.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_d8.fileName.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_d8.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_d8.fileName.d.d)->super_QArrayData,2,0x10);
    }
  }
  iVar10 = (int)(this->applicationFonts).d.size + -1;
LAB_0049e14b:
  if ((local_88.d.size == 0) && ((fontData->d).size != 0)) {
    QString::number((int)&local_118,iVar10);
    local_d8.data.d.ptr = local_108;
    local_d8.data.d.d = (Data *)pQStack_110;
    local_d8.fileName.d.size = (qsizetype)local_118;
    local_d8.fileName.d.d = (Data *)0xe;
    local_d8.fileName.d.ptr = L":qmemoryfonts/";
    local_118 = (QArrayData *)0x0;
    pQStack_110 = (QArrayData *)0x0;
    local_108 = (char *)0x0;
    QStringBuilder<QLatin1String,_QString>::convertTo<QString>
              (&local_f8,(QStringBuilder<QLatin1String,_QString> *)&local_d8);
    pcVar6 = local_88.d.ptr;
    pDVar5 = local_88.d.d;
    qVar4 = local_f8.d.size;
    pDVar3 = local_f8.d.d;
    local_f8.d.d = local_88.d.d;
    local_88.d.d = pDVar3;
    local_88.d.ptr = local_f8.d.ptr;
    local_f8.d.ptr = pcVar6;
    local_f8.d.size = local_88.d.size;
    local_88.d.size = qVar4;
    if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_d8.fileName.d.size != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_d8.fileName.d.size)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_d8.fileName.d.size)->_q_value).super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_d8.fileName.d.size)->_q_value).super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate((QArrayData *)local_d8.fileName.d.size,2,0x10);
      }
    }
    if (local_118 != (QArrayData *)0x0) {
      LOCK();
      (local_118->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_118->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_118->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_118,2,0x10);
      }
    }
  }
  iVar7 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xd])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0x38))
            (&local_130,(long *)CONCAT44(extraout_var,iVar7),&QStack_70,&local_88,&local_88);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_130);
  if (local_58.size == 0) {
    iVar10 = -1;
  }
  else {
    pAVar9 = QList<QFontDatabasePrivate::ApplicationFont>::data(&this->applicationFonts);
    QString::operator=(&pAVar9[iVar10].fileName,&local_88);
    QByteArray::operator=(&pAVar9[iVar10].data,&QStack_70);
    QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties>::operator=
              (&pAVar9[iVar10].properties.d,&local_58);
    this_00 = QFontCache::instance();
    QFontCache::clear(this_00);
    QHashPrivate::Data<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node>::clear
              (&(this->fallbacksCache).d);
    (this->fallbacksCache).total = 0;
    (this->fallbacksCache).chain.next = &(this->fallbacksCache).chain;
    (this->fallbacksCache).chain.prev = &(this->fallbacksCache).chain;
    QGuiApplication::fontDatabaseChanged(QCoreApplication::self);
  }
  QArrayDataPointer<QFontDatabasePrivate::ApplicationFont::Properties>::~QArrayDataPointer
            (&local_58);
  if (&(QStack_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((QStack_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((QStack_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QStack_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(QStack_70.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar10;
}

Assistant:

int QFontDatabasePrivate::addAppFont(const QByteArray &fontData, const QString &fileName)
{
    QFontDatabasePrivate::ApplicationFont font;
    font.data = fontData;
    font.fileName = fileName;

    Q_TRACE(QFontDatabasePrivate_addAppFont, fileName);

    int i;
    for (i = 0; i < applicationFonts.size(); ++i)
        if (applicationFonts.at(i).isNull())
            break;
    if (i >= applicationFonts.size()) {
        applicationFonts.append(ApplicationFont());
        i = applicationFonts.size() - 1;
    }

    if (font.fileName.isEmpty() && !fontData.isEmpty())
        font.fileName = ":qmemoryfonts/"_L1 + QString::number(i);

    auto *platformFontDatabase = QGuiApplicationPrivate::platformIntegration()->fontDatabase();
    platformFontDatabase->addApplicationFont(font.data, font.fileName, &font);
    if (font.properties.isEmpty())
        return -1;

    applicationFonts[i] = font;

    // The font cache may have cached lookups for the font that was now
    // loaded, so it has to be flushed.
    QFontCache::instance()->clear();

    fallbacksCache.clear();

    emit qApp->fontDatabaseChanged();

    return i;
}